

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsip.cpp
# Opt level: O1

bool __thiscall tsip::is_report_found(tsip *this,_command_packet *_cmd)

{
  byte bVar1;
  UINT8 UVar2;
  bool bVar3;
  
  bVar1 = (_cmd->raw).data[0];
  bVar3 = false;
  if (bVar1 < 0x35) {
    if (((bVar1 == 0x1e) || (bVar1 == 0x1f)) || (bVar3 = false, bVar1 == 0x25)) {
      bVar3 = (bool)((*(byte *)&this->m_updated & 8) >> 3);
    }
  }
  else {
    if (bVar1 == 0x35) {
      return (bool)((*(byte *)&this->m_updated & 0x40) >> 6);
    }
    if (bVar1 == 0x37) {
      return (~(this->m_updated).value & 3U) == 0;
    }
    if (bVar1 == 0x8e) {
      UVar2 = (_cmd->raw).data[1];
      if (UVar2 == 0xac) {
        return (bool)((*(byte *)((long)&this->m_updated + 1) & 2) >> 1);
      }
      if (UVar2 != 0xab) {
        if (UVar2 == 0xa2) {
          return (bool)((*(byte *)((long)&this->m_updated + 1) & 4) >> 2);
        }
        return false;
      }
      return (bool)(*(byte *)((long)&this->m_updated + 1) & 1);
    }
  }
  return bVar3;
}

Assistant:

bool tsip::is_report_found(_command_packet &_cmd) {
	bool isfound = false;

	switch (_cmd.report.code){

		// 0x1e
		case COMMAND_COLD_FACTORY_RESET :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x1f
		case COMMAND_REQUEST_SW_VERSION :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x25
		case COMMAND_WARM_RESET_SELF_TEST :
			//0x45 report_sw_version
			if (m_updated.report.sw_version) {
				isfound = true;
			}
			break;

		// 0x35
		case COMMAND_SET_IO_OPTIONS :
			// 0x55	 REPORT_IO_OPTIONS
			if (m_updated.report.io_options) {
				isfound = true;
			}
			break;

		// 0x37
		case COMMAND_REQUEST_POSITION :
			// 0x42 REPORT_ECEF_POSITION_S
			if (m_updated.report.ecef_position_s && m_updated.report.ecef_position_d) {
				isfound = true;
			}
			// 0x43 REPORT_ECEF_VELOCITY

			// 0x83 REPORT_ECEF_POSITION_D
			//if (m_updated.report.ecef_position_d) {
			//	isfound = true;
			//}
			break;
		//0x8E
		case COMMAND_SUPER_PACKET:
			switch (_cmd.extended.subcode) {
				// 0xa2
				case REPORT_SUPER_UTC_GPS_TIME :
					if (m_updated.report.utc_gps_time) {
						isfound = true;
					}
					break;
				// 0xab
				case REPORT_SUPER_PRIMARY_TIME :
					if (m_updated.report.primary_time) {
						isfound = true;
					}
					break;
				// 0xac
				case REPORT_SUPER_SECONDARY_TIME :
					if (m_updated.report.secondary_time) {
						isfound = true;
					}
					break;
			}
			break;
		default :
			isfound = false;
		}
	return isfound;
}